

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::ExtensionSet::ParseField
          (ExtensionSet *this,uint64 tag,char *ptr,Message *containing_type,
          InternalMetadataWithArena *metadata,ParseContext *ctx)

{
  bool bVar1;
  char *pcVar2;
  ExtensionInfo *in_RSI;
  ParseContext *in_RDI;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *in_R8;
  bool *unaff_retaddr;
  ExtensionInfo extension;
  bool was_packed_on_wire;
  int number;
  char *in_stack_000000b0;
  InternalMetadataWithArena *in_stack_000000b8;
  ExtensionInfo *in_stack_000000c0;
  bool in_stack_000000cb;
  int in_stack_000000cc;
  ExtensionSet *in_stack_000000d0;
  ParseContext *in_stack_00000130;
  ParseContext *ctx_00;
  char *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 local_5c;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *local_50;
  Message *in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  ExtensionSet *in_stack_ffffffffffffffe8;
  
  local_5c = (undefined4)((ulong)in_RSI >> 3);
  local_50 = in_R8;
  ExtensionInfo::ExtensionInfo((ExtensionInfo *)&stack0xffffffffffffff80);
  ctx_00 = (ParseContext *)&stack0xffffffffffffffa3;
  bVar1 = FindExtension(in_stack_ffffffffffffffe8,SUB84(in_stack_ffffffffffffffe0,4),
                        (uint32)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_RDI,in_RSI,
                        unaff_retaddr);
  if (bVar1) {
    pcVar2 = ParseFieldWithExtensionInfo<google::protobuf::internal::InternalMetadataWithArena>
                       (in_stack_000000d0,in_stack_000000cc,in_stack_000000cb,in_stack_000000c0,
                        in_stack_000000b8,in_stack_000000b0,in_stack_00000130);
  }
  else {
    if (((uint)*(undefined8 *)local_50 & 1) == 1) {
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                (local_50);
    }
    else {
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
      ::mutable_unknown_fields_slow
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  *)in_stack_ffffffffffffff90);
    }
    pcVar2 = UnknownFieldParse((uint64)local_50,(UnknownFieldSet *)in_RSI,in_stack_ffffffffffffff60,
                               ctx_00);
  }
  return pcVar2;
}

Assistant:

const char* ExtensionSet::ParseField(
    uint64 tag, const char* ptr, const Message* containing_type,
    internal::InternalMetadataWithArena* metadata,
    internal::ParseContext* ctx) {
  int number = tag >> 3;
  bool was_packed_on_wire;
  ExtensionInfo extension;
  if (!FindExtension(tag & 7, number, containing_type, ctx, &extension,
                     &was_packed_on_wire)) {
    return UnknownFieldParse(tag, metadata->mutable_unknown_fields(), ptr, ctx);
  }
  return ParseFieldWithExtensionInfo(number, was_packed_on_wire, extension,
                                     metadata, ptr, ctx);
}